

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O0

Color ftxui::Color::HSV(uint8_t h,uint8_t s,uint8_t v)

{
  byte bVar1;
  char cVar2;
  uint8_t green;
  uint8_t blue;
  uint8_t red;
  uint8_t t;
  uint8_t q;
  uint8_t p;
  uint8_t remainder;
  uint8_t region;
  uint8_t v_local;
  uint8_t s_local;
  uint8_t h_local;
  
  if (s == '\0') {
    Color((Color *)&t,v,v,v);
  }
  else {
    cVar2 = (char)((ulong)h * 0x5f417d1 >> 0x20);
    bVar1 = (h + cVar2 * -0x2b) * '\x06';
    green = (uint8_t)((uint)v * (s ^ 0xff) >> 8);
    blue = (uint8_t)((uint)v * ((uint)s * (uint)bVar1 >> 8 ^ 0xff) >> 8);
    red = (uint8_t)((uint)v * ((uint)s * (bVar1 ^ 0xff) >> 8 ^ 0xff) >> 8);
    switch(cVar2) {
    case '\0':
      Color((Color *)&t,v,red,green);
      break;
    case '\x01':
      Color((Color *)&t,blue,v,green);
      break;
    case '\x02':
      Color((Color *)&t,green,v,red);
      break;
    case '\x03':
      Color((Color *)&t,green,blue,v);
      break;
    case '\x04':
      Color((Color *)&t,red,green,v);
      break;
    case '\x05':
      Color((Color *)&t,v,green,blue);
      break;
    default:
      Color((Color *)&t,'\0','\0','\0');
    }
  }
  return _t;
}

Assistant:

Color Color::HSV(uint8_t h, uint8_t s, uint8_t v) {
  if (s == 0)
    return Color(v, v, v);

  uint8_t region = h / 43;
  uint8_t remainder = (h - (region * 43)) * 6;
  uint8_t p = (v * (255 - s)) >> 8;
  uint8_t q = (v * (255 - ((s * remainder) >> 8))) >> 8;
  uint8_t t = (v * (255 - ((s * (255 - remainder)) >> 8))) >> 8;

  // clang-format off
  switch (region) {
    case 0: return Color(v,t,p);
    case 1: return Color(q,v,p);
    case 2: return Color(p,v,t);
    case 3: return Color(p,q,v);
    case 4: return Color(t,p,v);
    case 5: return Color(v,p,q);
  }
  // clang-format on

  return Color(0, 0, 0);
}